

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void show_grid_cb(Fl_Widget *param_1,void *param_2)

{
  Fl_Round_Button **ppFVar1;
  char buf [128];
  char acStack_98 [136];
  
  sprintf(acStack_98,"%d",(ulong)(uint)gridx);
  Fl_Input_::value((Fl_Input_ *)horizontal_input,acStack_98);
  sprintf(acStack_98,"%d",(ulong)(uint)gridy);
  Fl_Input_::value((Fl_Input_ *)vertical_input,acStack_98);
  sprintf(acStack_98,"%d",(ulong)(uint)snap);
  Fl_Input_::value((Fl_Input_ *)snap_input,acStack_98);
  Fl_Button::value((Fl_Button *)guides_toggle,show_guides);
  ppFVar1 = def_widget_size;
  if (8 < Fl_Widget_Type::default_size) {
    if (Fl_Widget_Type::default_size < 0xc) {
      ppFVar1 = def_widget_size + 1;
    }
    else if (Fl_Widget_Type::default_size < 0xf) {
      ppFVar1 = def_widget_size + 2;
    }
    else if (Fl_Widget_Type::default_size < 0x13) {
      ppFVar1 = def_widget_size + 3;
    }
    else if (Fl_Widget_Type::default_size < 0x19) {
      ppFVar1 = def_widget_size + 4;
    }
    else {
      if (0x20 < Fl_Widget_Type::default_size) goto LAB_0018b30f;
      ppFVar1 = def_widget_size + 5;
    }
  }
  Fl_Button::setonly((Fl_Button *)*ppFVar1);
LAB_0018b30f:
  Fl_Window::hotspot(&grid_window->super_Fl_Window,(Fl_Widget *)grid_window,0);
  (*(grid_window->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  return;
}

Assistant:

void show_grid_cb(Fl_Widget *, void *) {
  char buf[128];
  sprintf(buf,"%d",gridx); horizontal_input->value(buf);
  sprintf(buf,"%d",gridy); vertical_input->value(buf);
  sprintf(buf,"%d",snap); snap_input->value(buf);
  guides_toggle->value(show_guides);
  int s = Fl_Widget_Type::default_size;
  if (s<=8) def_widget_size[0]->setonly();
  else if (s<=11) def_widget_size[1]->setonly();
  else if (s<=14) def_widget_size[2]->setonly();
  else if (s<=18) def_widget_size[3]->setonly();
  else if (s<=24) def_widget_size[4]->setonly();
  else if (s<=32) def_widget_size[5]->setonly();
  grid_window->hotspot(grid_window);
  grid_window->show();
}